

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::RepeatedFieldInsertionIteratorsTest_Fibonacci_Test::TestBody
          (RepeatedFieldInsertionIteratorsTest_Fibonacci_Test *this)

{
  RepeatedField<int> *this_00;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *in_R9;
  _List_node_base *p_Var4;
  ulong uVar5;
  pointer *__ptr;
  _List_node_base *p_Var6;
  AssertHelper AStack_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string local_48;
  
  p_Var4 = (_List_node_base *)&(this->super_RepeatedFieldInsertionIteratorsTest).fibonacci;
  p_Var6 = (this->super_RepeatedFieldInsertionIteratorsTest).fibonacci.
           super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
  ;
  this_00 = &(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0._impl_.
             repeated_int32_;
  if ((undefined1  [816])
      ((undefined1  [816])(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0 &
      (undefined1  [816])0x4) == (undefined1  [816])0x0) {
    piVar2 = (int *)((long)&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0 +
                    0x18);
  }
  else {
    piVar2 = (int *)protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  do {
    if (p_Var6 == p_Var4) {
LAB_0092bd56:
      uVar5 = (this_00->soo_rep_).field_0.long_rep.elements_int;
      if ((uVar5 & 4) == 0) {
        piVar2 = (int *)((long)&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.
                                field_0 + 0x18);
      }
      else {
        piVar2 = (int *)protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
        uVar5 = (this_00->soo_rep_).field_0.long_rep.elements_int;
      }
      if ((uVar5 & 4) == 0) {
        pcVar3 = (char *)((long)&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.
                                 field_0 + 0x18);
      }
      else {
        pcVar3 = protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
      }
      iVar1 = protobuf::internal::SooRep::size(&this_00->soo_rep_,(uVar5 & 4) == 0);
      while( true ) {
        if (piVar2 == (int *)(pcVar3 + (long)iVar1 * 4)) {
          return;
        }
        p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
                 super__List_node_base._M_next;
        if (*piVar2 != *(int *)&p_Var4[1]._M_next) break;
        piVar2 = piVar2 + 1;
      }
      local_58[0] = (internal)0x0;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,local_58,
                 (AssertionResult *)
                 "std::equal(protobuffer.repeated_int32().begin(), protobuffer.repeated_int32().end(), fibonacci.begin())"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0x538,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&AStack_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
      return;
    }
    if (*(int *)&p_Var6[1]._M_next != *piVar2) {
      local_58[0] = (internal)0x0;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,local_58,
                 (AssertionResult *)
                 "std::equal(fibonacci.begin(), fibonacci.end(), protobuffer.repeated_int32().begin())"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0x535,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&AStack_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      goto LAB_0092bd56;
    }
    p_Var6 = p_Var6->_M_next;
    piVar2 = piVar2 + 1;
  } while( true );
}

Assistant:

TEST_F(RepeatedFieldInsertionIteratorsTest, Fibonacci) {
  EXPECT_TRUE(std::equal(fibonacci.begin(), fibonacci.end(),
                         protobuffer.repeated_int32().begin()));
  EXPECT_TRUE(std::equal(protobuffer.repeated_int32().begin(),
                         protobuffer.repeated_int32().end(),
                         fibonacci.begin()));
}